

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

Tree * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::treeFromString
          (Tree *__return_storage_ptr__,Interpreter *this,string *s)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  Callbacks *cb;
  Tree *extraout_RAX;
  Tree *pTVar4;
  csubstr csrc;
  Parser local_ad0;
  
  if (s == (string *)0x0 || this != (Interpreter *)0x0) {
    cb = c4::yml::get_callbacks();
    c4::yml::Parser::Parser(&local_ad0,cb,(ParserOptions)0x0);
    csrc.len = (size_t)s;
    csrc.str = (char *)this;
    c4::yml::Parser::parse_in_arena(__return_storage_ptr__,&local_ad0,(csubstr)ZEXT816(0),csrc);
    c4::yml::Parser::~Parser(&local_ad0);
    return extraout_RAX;
  }
  eVar3 = c4::get_error_flags();
  if ((eVar3 & 1) != 0) {
    bVar2 = c4::is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      pTVar4 = (Tree *)(*pcVar1)();
      return pTVar4;
    }
  }
  c4::handle_error(0x1f9037,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x147e,"str || !len_");
}

Assistant:

const ryml::Tree treeFromString(const std::string& s) {
        return ryml::parse_in_arena(ryml::to_csubstr(s));
    }